

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LTChannel.cpp
# Opt level: O3

bool LTACMasterdataChannel::RequestMasterData(FDKeyTy *keyAc,string *callSign,double distance)

{
  bool bVar1;
  unsigned_long d;
  acStatUpdateTy acUpd;
  string local_98;
  acStatUpdateTy local_78;
  
  bVar1 = false;
  if (((keyAc->key)._M_string_length != 0) && (bVar1 = false, keyAc->eKeyType == KEY_ICAO)) {
    d = 0xffffffff;
    if (!NAN(distance)) {
      d = (long)(distance - 9.223372036854776e+18) & (long)distance >> 0x3f | (long)distance;
    }
    str_toupper_c(&local_98,callSign);
    acStatUpdateTy::acStatUpdateTy(&local_78,keyAc,&local_98,d);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_98._M_dataplus._M_p != &local_98.field_2) {
      operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
    }
    bVar1 = PassOnRequest((LTACMasterdataChannel *)0x0,&local_78);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_78.callSign._M_dataplus._M_p != &local_78.callSign.field_2) {
      operator_delete(local_78.callSign._M_dataplus._M_p,
                      local_78.callSign.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_78.acKey.key._M_dataplus._M_p != &local_78.acKey.key.field_2) {
      operator_delete(local_78.acKey.key._M_dataplus._M_p,
                      local_78.acKey.key.field_2._M_allocated_capacity + 1);
    }
  }
  return bVar1;
}

Assistant:

bool LTACMasterdataChannel::RequestMasterData (const LTFlightData::FDKeyTy& keyAc,
                                               const std::string& callSign,
                                               double distance)
{
    // Sanity check
    if (keyAc.empty() || keyAc.eKeyType != LTFlightData::KEY_ICAO) return false;
    
    // Prepare the request object that is to be added later
    const unsigned long dist = std::isnan(distance) ? UINT_MAX : (unsigned long) (distance);
    const acStatUpdateTy acUpd (keyAc,str_toupper_c(callSign),dist);

    // Pass the request to the first channel of our list
    return PassOnRequest(nullptr, acUpd);
}